

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSoftBody.cpp
# Opt level: O2

void __thiscall btSoftBody::applyForces(btSoftBody *this)

{
  btVector3 *v;
  float fVar1;
  uint uVar2;
  Node *pNVar3;
  undefined8 windVelocity;
  int faceIndex;
  ulong uVar4;
  int iVar5;
  long lVar6;
  ulong uVar7;
  btScalar bVar8;
  CProfileSample __profile;
  float local_90;
  float local_8c;
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  btVector3 local_68;
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  
  CProfileManager::Start_Profile("SoftBody applyForces");
  local_78 = ZEXT416((uint)(this->m_cfg).kDG);
  local_8c = (this->m_cfg).kPR;
  fVar1 = (this->m_cfg).kVC;
  local_88 = ZEXT416((uint)(this->m_cfg).kLF);
  if ((local_8c == 0.0) && (!NAN(local_8c))) {
    local_48 = ZEXT816(0);
    local_58 = ZEXT816(0);
    if (fVar1 <= 0.0) goto LAB_001a0ba1;
  }
  bVar8 = getVolume(this);
  local_48 = ZEXT416((uint)((1.0 / ABS(bVar8)) * local_8c));
  local_58 = ZEXT416((uint)(((this->m_pose).m_volume - bVar8) * fVar1));
LAB_001a0ba1:
  local_78._0_4_ = -(uint)(0.0 < (float)local_88._0_4_ || 0.0 < (float)local_78._0_4_);
  uVar2 = (this->m_nodes).m_size;
  local_88._0_8_ = &this->m_windVelocity;
  uVar7 = 0;
  uVar4 = (ulong)uVar2;
  if ((int)uVar2 < 1) {
    uVar4 = uVar7;
  }
  lVar6 = 0x40;
  for (; windVelocity = local_88._0_8_, uVar4 != uVar7; uVar7 = uVar7 + 1) {
    pNVar3 = (this->m_nodes).m_data;
    if (0.0 < *(float *)((long)(pNVar3->m_q).m_floats + lVar6)) {
      if ((local_78 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        addAeroForceToNode(this,(btVector3 *)local_88._0_8_,(int)uVar7);
      }
      v = (btVector3 *)((long)(pNVar3->m_x).m_floats + lVar6);
      if ((local_8c != 0.0) || (NAN(local_8c))) {
        local_90 = *(float *)((long)(pNVar3->m_q).m_floats + lVar6 + 4) * (float)local_48._0_4_;
        local_68 = operator*(v,&local_90);
        btVector3::operator+=
                  ((btVector3 *)
                   ((long)&(((Node *)(&pNVar3->m_x + -1))->super_Feature).super_Element.m_tag +
                   lVar6),&local_68);
      }
      if (0.0 < fVar1) {
        local_90 = *(float *)((long)(pNVar3->m_q).m_floats + lVar6 + 4) * (float)local_58._0_4_;
        local_68 = operator*(v,&local_90);
        btVector3::operator+=
                  ((btVector3 *)
                   ((long)&(((Node *)(&pNVar3->m_x + -1))->super_Feature).super_Element.m_tag +
                   lVar6),&local_68);
      }
    }
    lVar6 = lVar6 + 0x78;
  }
  iVar5 = (this->m_faces).m_size;
  faceIndex = 0;
  if (iVar5 < 1) {
    iVar5 = 0;
  }
  for (; iVar5 != faceIndex; faceIndex = faceIndex + 1) {
    addAeroForceToFace(this,(btVector3 *)windVelocity,faceIndex);
  }
  CProfileSample::~CProfileSample(&__profile);
  return;
}

Assistant:

void				btSoftBody::applyForces()
{

	BT_PROFILE("SoftBody applyForces");
//	const btScalar					dt =			m_sst.sdt;
	const btScalar					kLF =			m_cfg.kLF;
	const btScalar					kDG =			m_cfg.kDG;
	const btScalar					kPR =			m_cfg.kPR;
	const btScalar					kVC =			m_cfg.kVC;
	const bool						as_lift =		kLF>0;
	const bool						as_drag =		kDG>0;
	const bool						as_pressure =	kPR!=0;
	const bool						as_volume =		kVC>0;
	const bool						as_aero =		as_lift	||
													as_drag		;
	//const bool						as_vaero =		as_aero	&&
	//												(m_cfg.aeromodel < btSoftBody::eAeroModel::F_TwoSided);
	//const bool						as_faero =		as_aero	&&
	//												(m_cfg.aeromodel >= btSoftBody::eAeroModel::F_TwoSided);
	const bool						use_medium =	as_aero;
	const bool						use_volume =	as_pressure	||
		as_volume	;
	btScalar						volume =		0;
	btScalar						ivolumetp =		0;
	btScalar						dvolumetv =		0;
	btSoftBody::sMedium	medium;
	if(use_volume)
	{
		volume		=	getVolume();
		ivolumetp	=	1/btFabs(volume)*kPR;
		dvolumetv	=	(m_pose.m_volume-volume)*kVC;
	}
	/* Per vertex forces			*/ 
	int i,ni;

	for(i=0,ni=m_nodes.size();i<ni;++i)
	{
		btSoftBody::Node&	n=m_nodes[i];
		if(n.m_im>0)
		{
			if(use_medium)
			{
				/* Aerodynamics			*/ 
				addAeroForceToNode(m_windVelocity, i);
			}
			/* Pressure				*/ 
			if(as_pressure)
			{
				n.m_f	+=	n.m_n*(n.m_area*ivolumetp);
			}
			/* Volume				*/ 
			if(as_volume)
			{
				n.m_f	+=	n.m_n*(n.m_area*dvolumetv);
			}
		}
	}

	/* Per face forces				*/ 
	for(i=0,ni=m_faces.size();i<ni;++i)
	{
	//	btSoftBody::Face&	f=m_faces[i];

		/* Aerodynamics			*/ 
		addAeroForceToFace(m_windVelocity, i);	
	}
}